

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsTextItem::focusInEvent(QGraphicsTextItem *this,QFocusEvent *event)

{
  int iVar1;
  QGraphicsTextItemPrivate *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *this_00;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QGraphicsTextItemPrivate::sendControlEvent(in_RSI,(QEvent *)in_RDI);
  iVar1 = QFocusEvent::reason();
  if (iVar1 == 0) {
    *(byte *)((long)in_RDI[2]._vptr_QGraphicsItem + 0x2e) =
         *(byte *)((long)in_RDI[2]._vptr_QGraphicsItem + 0x2e) & 0xfe | 1;
  }
  QRectF::QRectF(&local_28);
  QGraphicsItem::update(this_00,(QRectF *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTextItem::focusInEvent(QFocusEvent *event)
{
    dd->sendControlEvent(event);
    if (event->reason() == Qt::MouseFocusReason) {
        dd->clickCausedFocus = 1;
    }
    update();
}